

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O1

void If_ManSetupSetAll(If_Man_t *p,int nCrossCut)

{
  If_Set_t *pIVar1;
  long lVar2;
  int level;
  size_t __size;
  uint uVar4;
  If_Set_t *pSet;
  undefined1 auVar6 [16];
  If_Man_t *pIVar3;
  ulong uVar5;
  
  uVar5 = (long)nCrossCut + 0x80;
  __size = (long)p->nSetBytes * uVar5;
  pIVar1 = (If_Set_t *)malloc(__size);
  level = (int)__size;
  p->pMemAnd = pIVar1;
  p->pFreeList = pIVar1;
  pSet = pIVar1;
  if (-0x80 < nCrossCut) {
    do {
      pIVar3 = p;
      If_ManSetupSet(p,pSet);
      level = (int)pIVar3;
      if ((int)uVar5 == 1) {
        pIVar1 = (If_Set_t *)0x0;
      }
      else {
        pIVar1 = (If_Set_t *)((long)&pSet->nCutsMax + (long)p->nSetBytes);
      }
      pSet->pNext = pIVar1;
      uVar4 = (int)uVar5 - 1;
      uVar5 = (ulong)uVar4;
      pSet = pIVar1;
    } while (uVar4 != 0);
  }
  if (pIVar1 != (If_Set_t *)0x0) {
    __assert_fail("pCutSet == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMan.c"
                  ,0x2c2,"void If_ManSetupSetAll(If_Man_t *, int)");
  }
  if (p->pPars->fVerbose == 0) {
    return;
  }
  lVar2 = (long)p->nObjBytes + 0x10;
  auVar6._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar6._0_8_ = lVar2;
  auVar6._12_4_ = 0x45300000;
  Abc_Print(level,"Node = %7d.  Ch = %5d.  Total mem = %7.2f MB. Peak cut mem = %7.2f MB.\n",
            (double)p->vObjs->nSize *
            ((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) * 9.5367431640625e-07,
            (double)nCrossCut * (double)p->nSetBytes * 9.5367431640625e-07,(ulong)(uint)p->nObjs[4],
            (ulong)(uint)p->nChoices);
  return;
}

Assistant:

void If_ManSetupSetAll( If_Man_t * p, int nCrossCut )
{
    If_Set_t * pCutSet;
    int i, nCutSets;
    nCutSets = 128 + nCrossCut;
    p->pFreeList = p->pMemAnd = pCutSet = (If_Set_t *)ABC_ALLOC( char, nCutSets * p->nSetBytes );
    for ( i = 0; i < nCutSets; i++ )
    {
        If_ManSetupSet( p, pCutSet );
        if ( i == nCutSets - 1 )
            pCutSet->pNext = NULL;
        else
            pCutSet->pNext = (If_Set_t *)( (char *)pCutSet + p->nSetBytes );
        pCutSet = pCutSet->pNext;
    }
    assert( pCutSet == NULL );

    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "Node = %7d.  Ch = %5d.  Total mem = %7.2f MB. Peak cut mem = %7.2f MB.\n", 
            If_ManAndNum(p), p->nChoices,
            1.0 * (p->nObjBytes + 2*sizeof(void *)) * If_ManObjNum(p) / (1<<20), 
            1.0 * p->nSetBytes * nCrossCut / (1<<20) );
    }
//    Abc_Print( 1, "Cross cut = %d.\n", nCrossCut );

}